

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O1

void __thiscall json_service::compiles5c(json_service *this,object *f)

{
  bool bVar1;
  const_iterator cVar2;
  double *pdVar3;
  ostream *poVar4;
  runtime_error *this_00;
  ostringstream oss;
  undefined1 local_1f8 [16];
  _Alloc_hider local_1e8;
  char local_1d8 [16];
  string local_1c8 [32];
  undefined1 local_1a8 [16];
  _Alloc_hider local_198;
  char local_188 [344];
  
  local_1a8._0_8_ = (char *)0x0;
  local_1a8._8_8_ = (char *)0x0;
  local_198._M_p = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"member","");
  cVar2 = std::
          _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
          ::find(&f->_M_t,(key_type *)local_1a8);
  if ((_Rb_tree_header *)cVar2._M_node == &(f->_M_t)._M_impl.super__Rb_tree_header) {
    bVar1 = false;
  }
  else {
    local_1f8._0_8_ = (char *)0x0;
    local_1f8._8_8_ = (char *)0x0;
    local_1e8._M_p = local_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"member","");
    std::
    _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
    ::find(&f->_M_t,(key_type *)local_1f8);
    pdVar3 = (double *)cppcms::json::value::number();
    bVar1 = *pdVar3 == 1.0;
    if (local_1e8._M_p != local_1d8) {
      operator_delete(local_1e8._M_p);
    }
  }
  if (local_198._M_p != local_188) {
    operator_delete(local_198._M_p);
  }
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error ",6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
               ,0x5f);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4," f.find(\"member\")!=f.end() && f.find(\"member\")->second.number()==1",0x42)
    ;
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(this_00,local_1c8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void compiles5c(cppcms::json::object const f) { TEST(f.find("member")!=f.end() && f.find("member")->second.number()==1); }